

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

int __thiscall google::protobuf::internal::ExtensionSet::Extension::GetSize(Extension *this)

{
  byte bVar1;
  int iVar2;
  LogMessage *pLVar3;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  LogFinisher local_29;
  
  if (this->is_repeated == false) {
    LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
               ,0x6ac);
    pLVar3 = LogMessage::operator<<(&local_d8,"CHECK failed: is_repeated: ");
    LogFinisher::operator=((LogFinisher *)&local_a0,pLVar3);
    LogMessage::~LogMessage(&local_d8);
  }
  bVar1 = this->type;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
               ,0x3c);
    pLVar3 = LogMessage::operator<<
                       (&local_a0,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=((LogFinisher *)&local_68,pLVar3);
    LogMessage::~LogMessage(&local_a0);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    iVar2 = ((this->field_0).repeated_int32_value)->current_size_;
    break;
  case 9:
  case 10:
    iVar2 = (int)((this->field_0).string_value)->_M_string_length;
    break;
  default:
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
               ,0x6bf);
    pLVar3 = LogMessage::operator<<(&local_68,"Can\'t get here.");
    LogFinisher::operator=(&local_29,pLVar3);
    LogMessage::~LogMessage(&local_68);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ExtensionSet::Extension::GetSize() const {
  GOOGLE_DCHECK(is_repeated);
  switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)   \
  case WireFormatLite::CPPTYPE_##UPPERCASE: \
    return repeated_##LOWERCASE##_value->size()

    HANDLE_TYPE(INT32, int32);
    HANDLE_TYPE(INT64, int64);
    HANDLE_TYPE(UINT32, uint32);
    HANDLE_TYPE(UINT64, uint64);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(ENUM, enum);
    HANDLE_TYPE(STRING, string);
    HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return 0;
}